

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 01.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  char local_14 [8];
  char eme [8];
  
  eme[0] = '\0';
  eme[1] = '\0';
  eme[2] = '\0';
  eme[3] = '\0';
  setlocale(6,"portuguese-brazilian");
  builtin_strncpy(local_14,"\x1b[1;35m",8);
  std::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Quatro regras simples para a vida no esconderijo: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Um: Nunca confie em um policial vestido de abrigo.");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Dois: Cuidado com o entusiasmo e com o amor.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6e2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6f8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Olhe fundo dentro daquele que o perguntou.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_724);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_73a);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_750);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "portuguese-brazilian");
    char eme[] = {0x1b, '[', '1', ';', '3', '5', 'm', 0};
    cout << eme;

    cout << "Quatro regras simples para a vida no esconderijo: " << endl
         << endl;
    cout << "Um: Nunca confie em um policial vestido de abrigo." << endl
         << endl;
    cout << "Dois: Cuidado com o entusiasmo e com o amor." << endl;
    cout << "Ambos são temporários da maneira mais ligeira." << endl
         << endl;
    cout << "Três: Quando perguntado se você se importa com o mundo..." << endl;
    cout << "Olhe fundo dentro daquele que o perguntou." << endl;
    cout << "Ele não perguntará novamente." << endl
         << endl;
    cout << "Quatro: Nunca dê seu nome verdadeiro." << endl
         << endl;
    cout << "Cinco? Se algum dia lhe pedirem que olhe pra sí mesmo,nunca o faça." << endl;

    return 0;
}